

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample.c
# Opt level: O2

int32 dumb_resample_n_2_2(int n,DUMB_RESAMPLER *resampler,sample_t_conflict *dst,int32 dst_size,
                         DUMB_VOLUME_RAMP_INFO *volume_left,DUMB_VOLUME_RAMP_INFO *volume_right,
                         double delta)

{
  int32 iVar1;
  
  if (n == 0x10) {
    iVar1 = dumb_resample_16_2_2(resampler,dst,dst_size,volume_left,volume_right,delta);
    return iVar1;
  }
  if (n == 8) {
    iVar1 = dumb_resample_8_2_2(resampler,dst,dst_size,volume_left,volume_right,delta);
    return iVar1;
  }
  iVar1 = dumb_resample_2_2(resampler,dst,dst_size,volume_left,volume_right,delta);
  return iVar1;
}

Assistant:

int32 dumb_resample_n_2_2(int n, DUMB_RESAMPLER *resampler, sample_t *dst, int32 dst_size, DUMB_VOLUME_RAMP_INFO * volume_left, DUMB_VOLUME_RAMP_INFO * volume_right, double delta)
{
	if (n == 8)
		return dumb_resample_8_2_2(resampler, dst, dst_size, volume_left, volume_right, delta);
	else if (n == 16)
		return dumb_resample_16_2_2(resampler, dst, dst_size, volume_left, volume_right, delta);
	else
		return dumb_resample_2_2(resampler, dst, dst_size, volume_left, volume_right, delta);
}